

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::Impl::exists(Impl *this,FileInfo *info)

{
  const_reference cVar1;
  __type _Var2;
  size_type sVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type *file;
  int i;
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  local_1c = 0;
  __lhs = in_RDI;
  do {
    sVar3 = std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
            ::size((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                    *)(in_RDI + 0x48));
    if ((int)sVar3 <= local_1c) {
      return false;
    }
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)__lhs,(size_type)in_RSI);
    if (cVar1) {
      pvVar4 = std::
               vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
               operator[]((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                           *)(in_RDI + 0x48),(long)local_1c);
      _Var2 = std::operator==(__lhs,in_RSI);
      if (((_Var2) && (*(long *)(in_RSI + 0x20) == (pvVar4->info).filesize)) &&
         (_Var2 = std::operator==(__lhs,in_RSI), _Var2)) {
        return true;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool exists(const FileInfo & info) const {
        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }

            const auto & file = files[i];
            if (info.uri == file.info.uri &&
                info.filesize == file.info.filesize &&
                info.filename == file.info.filename) {
                return true;
            }
        }

        return false;
    }